

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_238 [8];
  Server<Client> server;
  LoggingHandler<Client> logging_handler;
  undefined1 local_a8 [8];
  ExceptionHandler<Client> exception_handler;
  HTTPHandler<Client> http_handler;
  Config config;
  
  Server<Client>::Config::Config
            ((Config *)&http_handler.https_handler.main_dirpath.field_0x24,100,1000,0x1ed0);
  HTTPHandler<Client>::HTTPHandler
            ((HTTPHandler<Client> *)&exception_handler.next_handler,&RESOLVE_PATH_abi_cxx11_,
             &CERTS_PATH_abi_cxx11_);
  ExceptionHandler<Client>::ExceptionHandler
            ((ExceptionHandler<Client> *)local_a8,
             (IHandler<Client> *)&exception_handler.next_handler);
  LoggingHandler<Client>::LoggingHandler
            ((LoggingHandler<Client> *)
             &server.thread_pool.threads.
              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(IHandler<Client> *)local_a8);
  Server<Client>::Server
            ((Server<Client> *)local_238,
             (IHandler<Client> *)
             &server.thread_pool.threads.
              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Config *)&http_handler.https_handler.main_dirpath.field_0x24);
  Server<Client>::start((Server<Client> *)local_238);
  Server<Client>::~Server((Server<Client> *)local_238);
  HTTPHandler<Client>::~HTTPHandler((HTTPHandler<Client> *)&exception_handler.next_handler);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    HTTPHandler<Client> http_handler(RESOLVE_PATH, CERTS_PATH);
    ExceptionHandler<Client> exception_handler(http_handler);
    LoggingHandler<Client> logging_handler(exception_handler);
    Server<Client> server(logging_handler, config);

    server.start();
}